

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_encoder_rtc.cc
# Opt level: O0

void write_literal(aom_write_bit_buffer *wb,uint32_t data,uint8_t bits,uint32_t offset)

{
  uint bits_00;
  uint in_ECX;
  byte in_DL;
  uint in_ESI;
  uint32_t max;
  undefined3 in_stack_fffffffffffffff0;
  
  if (0x20 < in_DL) {
    die("Invalid bits value %d > 32\n",(ulong)in_DL);
  }
  bits_00 = (int)(1L << (in_DL & 0x3f)) - 1;
  if ((in_ECX <= in_ESI) && (in_ESI - in_ECX <= bits_00)) {
    aom_wb_write_unsigned_literal
              ((aom_write_bit_buffer *)CONCAT44(in_ESI,CONCAT13(in_DL,in_stack_fffffffffffffff0)),
               in_ECX,bits_00);
    return;
  }
  die("Invalid data, value %u out of range [%u, %lu]\n",(ulong)in_ESI,(ulong)in_ECX,
      (ulong)bits_00 + (ulong)in_ECX);
}

Assistant:

static void write_literal(struct aom_write_bit_buffer *wb, uint32_t data,
                          uint8_t bits, uint32_t offset = 0) {
  if (bits > 32) {
    die("Invalid bits value %d > 32\n", bits);
  }
  const uint32_t max = static_cast<uint32_t>(((uint64_t)1 << bits) - 1);
  if (data < offset || (data - offset) > max) {
    die("Invalid data, value %u out of range [%u, %" PRIu64 "]\n", data, offset,
        (uint64_t)max + offset);
  }
  aom_wb_write_unsigned_literal(wb, data - offset, bits);
}